

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O1

Result __thiscall
wabt::anon_unknown_67::BinaryReaderIR::OnTryExpr(BinaryReaderIR *this,Type sig_type)

{
  Result RVar1;
  __uniq_ptr_data<wabt::TryExpr,_std::default_delete<wabt::TryExpr>,_true,_true> local_38;
  unique_ptr<wabt::TryExpr,_std::default_delete<wabt::TryExpr>_> expr_ptr;
  
  MakeUnique<wabt::TryExpr>();
  SetBlockDeclaration(this,(BlockDeclaration *)
                           ((long)local_38.
                                  super___uniq_ptr_impl<wabt::TryExpr,_std::default_delete<wabt::TryExpr>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_wabt::TryExpr_*,_std::default_delete<wabt::TryExpr>_>
                                  .super__Head_base<0UL,_wabt::TryExpr_*,_false>._M_head_impl + 0x60
                           ),sig_type);
  expr_ptr._M_t.super___uniq_ptr_impl<wabt::TryExpr,_std::default_delete<wabt::TryExpr>_>._M_t.
  super__Tuple_impl<0UL,_wabt::TryExpr_*,_std::default_delete<wabt::TryExpr>_>.
  super__Head_base<0UL,_wabt::TryExpr_*,_false>._M_head_impl =
       (__uniq_ptr_data<wabt::TryExpr,_std::default_delete<wabt::TryExpr>,_true,_true>)
       (__uniq_ptr_data<wabt::TryExpr,_std::default_delete<wabt::TryExpr>,_true,_true>)
       local_38.super___uniq_ptr_impl<wabt::TryExpr,_std::default_delete<wabt::TryExpr>_>._M_t.
       super__Tuple_impl<0UL,_wabt::TryExpr_*,_std::default_delete<wabt::TryExpr>_>.
       super__Head_base<0UL,_wabt::TryExpr_*,_false>._M_head_impl;
  RVar1 = AppendExpr(this,(unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)&expr_ptr);
  if ((__uniq_ptr_impl<wabt::TryExpr,_std::default_delete<wabt::TryExpr>_>)
      expr_ptr._M_t.super___uniq_ptr_impl<wabt::TryExpr,_std::default_delete<wabt::TryExpr>_>._M_t.
      super__Tuple_impl<0UL,_wabt::TryExpr_*,_std::default_delete<wabt::TryExpr>_>.
      super__Head_base<0UL,_wabt::TryExpr_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<wabt::TryExpr,_std::default_delete<wabt::TryExpr>_>)0x0) {
    (**(code **)(*(long *)expr_ptr._M_t.
                          super___uniq_ptr_impl<wabt::TryExpr,_std::default_delete<wabt::TryExpr>_>.
                          _M_t.
                          super__Tuple_impl<0UL,_wabt::TryExpr_*,_std::default_delete<wabt::TryExpr>_>
                          .super__Head_base<0UL,_wabt::TryExpr_*,_false>._M_head_impl + 8))();
  }
  expr_ptr._M_t.super___uniq_ptr_impl<wabt::TryExpr,_std::default_delete<wabt::TryExpr>_>._M_t.
  super__Tuple_impl<0UL,_wabt::TryExpr_*,_std::default_delete<wabt::TryExpr>_>.
  super__Head_base<0UL,_wabt::TryExpr_*,_false>._M_head_impl =
       (__uniq_ptr_data<wabt::TryExpr,_std::default_delete<wabt::TryExpr>,_true,_true>)
       (__uniq_ptr_impl<wabt::TryExpr,_std::default_delete<wabt::TryExpr>_>)0x0;
  if (RVar1.enum_ != Error) {
    PushLabel(this,Try,(ExprList *)
                       ((long)local_38.
                              super___uniq_ptr_impl<wabt::TryExpr,_std::default_delete<wabt::TryExpr>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_wabt::TryExpr_*,_std::default_delete<wabt::TryExpr>_>
                              .super__Head_base<0UL,_wabt::TryExpr_*,_false>._M_head_impl + 0xe0),
              (Expr *)local_38.
                      super___uniq_ptr_impl<wabt::TryExpr,_std::default_delete<wabt::TryExpr>_>._M_t
                      .super__Tuple_impl<0UL,_wabt::TryExpr_*,_std::default_delete<wabt::TryExpr>_>.
                      super__Head_base<0UL,_wabt::TryExpr_*,_false>._M_head_impl);
  }
  return (Result)(uint)(RVar1.enum_ == Error);
}

Assistant:

Result BinaryReaderIR::OnTryExpr(Type sig_type) {
  auto expr_ptr = MakeUnique<TryExpr>();
  // Save expr so it can be used below, after expr_ptr has been moved.
  TryExpr* expr = expr_ptr.get();
  ExprList* expr_list = &expr->block.exprs;
  SetBlockDeclaration(&expr->block.decl, sig_type);
  CHECK_RESULT(AppendExpr(std::move(expr_ptr)));
  PushLabel(LabelType::Try, expr_list, expr);
  return Result::Ok;
}